

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::str_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,
          str_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t size_1;
  void *__s;
  buffer<char> *c;
  ulong uVar11;
  size_t size;
  ulong uVar12;
  size_t __len;
  size_t __n;
  
  uVar8 = (ulong)(uint)specs->width;
  uVar12 = f->size_;
  uVar9 = uVar12;
  if (uVar8 != 0) {
    if (uVar12 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      uVar11 = 0;
      do {
        uVar9 = uVar9 + 1;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
  }
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n = uVar8 - uVar9;
  if (uVar9 <= uVar8 && __n != 0) {
    uVar12 = ((uVar12 + uVar8) - uVar9) + lVar3;
    if ((ulong)puVar2[3] < uVar12) {
      (**(code **)*puVar2)(puVar2,uVar12);
    }
    puVar2[2] = uVar12;
    __s = (void *)(lVar3 + puVar2[1]);
    bVar1 = (specs->fill).data_[0];
    bVar7 = specs->field_0x9 & 0xf;
    if (bVar7 == 3) {
      uVar12 = __n >> 1;
      if (1 < __n) {
        switchD_010444a0::default(__s,(uint)bVar1,uVar12);
        __s = (void *)((long)__s + uVar12);
      }
      sVar4 = f->size_;
      if (sVar4 != 0) {
        pcVar5 = f->s;
        sVar10 = 0;
        do {
          *(char *)((long)__s + sVar10) = pcVar5[sVar10];
          sVar10 = sVar10 + 1;
        } while (sVar4 != sVar10);
        __s = (void *)((long)__s + sVar10);
      }
      __n = __n - uVar12;
    }
    else {
      if (bVar7 == 2) {
        switchD_010444a0::default(__s,(uint)bVar1,__n);
        sVar4 = f->size_;
        if (sVar4 == 0) {
          return;
        }
        pcVar5 = f->s;
        sVar10 = 0;
        do {
          *(char *)((long)__s + sVar10 + __n) = pcVar5[sVar10];
          sVar10 = sVar10 + 1;
        } while (sVar4 != sVar10);
        return;
      }
      sVar4 = f->size_;
      if (sVar4 != 0) {
        pcVar5 = f->s;
        sVar10 = 0;
        do {
          *(char *)((long)__s + sVar10) = pcVar5[sVar10];
          sVar10 = sVar10 + 1;
        } while (sVar4 != sVar10);
        __s = (void *)((long)__s + sVar10);
      }
    }
    switchD_010444a0::default(__s,(uint)bVar1,__n);
    return;
  }
  uVar9 = lVar3 + uVar12;
  if ((ulong)puVar2[3] < uVar9) {
    (**(code **)*puVar2)(puVar2,uVar9);
    uVar12 = f->size_;
  }
  puVar2[2] = uVar9;
  if (uVar12 != 0) {
    pcVar5 = f->s;
    lVar6 = puVar2[1];
    uVar9 = 0;
    do {
      *(char *)(lVar3 + lVar6 + uVar9) = pcVar5[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }